

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::CBString(CBString *this,CBStringList *l,char sep)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  uchar *puVar4;
  CBStringException *this_00;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t i;
  int c;
  char sep_local;
  CBStringList *l_local;
  CBString *this_local;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_0026f840;
  i._0_4_ = 1;
  bstr__cppwrapper_exception.msg.field_2._8_8_ = 0;
  while( true ) {
    uVar1 = bstr__cppwrapper_exception.msg.field_2._8_8_;
    sVar2 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                      ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                        bstr__cppwrapper_exception.msg.field_2._8_8_);
    i._0_4_ = (pvVar3->super_tagbstring).slen + 1 + (int)i;
    bstr__cppwrapper_exception.msg.field_2._8_8_ = bstr__cppwrapper_exception.msg.field_2._8_8_ + 1;
  }
  (this->super_tagbstring).mlen = (int)i;
  (this->super_tagbstring).slen = 0;
  puVar4 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
  (this->super_tagbstring).data = puVar4;
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"CBString::Failure in (CBStringList) constructor",&local_71);
    CBStringException::CBStringException((CBStringException *)local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_50);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  bstr__cppwrapper_exception.msg.field_2._8_8_ = 0;
  while( true ) {
    uVar1 = bstr__cppwrapper_exception.msg.field_2._8_8_;
    sVar2 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                      ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l);
    if (sVar2 <= (ulong)uVar1) break;
    if (bstr__cppwrapper_exception.msg.field_2._8_8_ != 0) {
      operator+=(this,sep);
    }
    pvVar3 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                        bstr__cppwrapper_exception.msg.field_2._8_8_);
    operator+=(this,pvVar3);
    bstr__cppwrapper_exception.msg.field_2._8_8_ = bstr__cppwrapper_exception.msg.field_2._8_8_ + 1;
  }
  return;
}

Assistant:

CBString::CBString (const struct CBStringList& l, char sep) {
int c;
size_t i;

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + 1;
	}

	mlen = c;
	slen = 0;
	data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}